

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::get_valid_actions
               (search *sch,v_array<unsigned_int> *valid_action,uint64_t idx,uint64_t n,
               uint64_t stack_depth,uint64_t state)

{
  uint uVar1;
  task_data *ptVar2;
  v_array<unsigned_int> *this;
  v_array<unsigned_int> *this_00;
  uint *puVar3;
  ulong in_RCX;
  ulong in_RDX;
  search *in_RDI;
  ulong in_R8;
  long in_R9;
  uint32_t i_1;
  size_t i;
  v_array<unsigned_int> *temp;
  v_array<unsigned_int> *heads;
  v_array<unsigned_int> *stack;
  uint32_t *sys;
  task_data *data;
  v_array<unsigned_int> *in_stack_ffffffffffffff88;
  v_array<unsigned_int> *in_stack_ffffffffffffff90;
  uint local_68;
  ulong local_60;
  
  ptVar2 = Search::search::get_task_data<task_data>(in_RDI);
  this = &ptVar2->heads;
  this_00 = &ptVar2->temp;
  v_array<unsigned_int>::clear(in_stack_ffffffffffffff90);
  if (ptVar2->transition_system == 1) {
    if (in_RDX <= in_RCX) {
      v_array<unsigned_int>::push_back(in_stack_ffffffffffffff90,(uint *)in_stack_ffffffffffffff88);
    }
    if (1 < in_R8) {
      v_array<unsigned_int>::push_back(in_stack_ffffffffffffff90,(uint *)in_stack_ffffffffffffff88);
    }
    if (((in_R8 != 0) && (in_R9 != 0)) && (in_RDX <= in_RCX)) {
      v_array<unsigned_int>::push_back(in_stack_ffffffffffffff90,(uint *)in_stack_ffffffffffffff88);
    }
  }
  else if (ptVar2->transition_system == 2) {
    v_array<unsigned_int>::clear(in_stack_ffffffffffffff90);
    for (local_60 = 0; local_60 < 5; local_60 = local_60 + 1) {
      v_array<unsigned_int>::push_back(in_stack_ffffffffffffff90,(uint *)in_stack_ffffffffffffff88);
    }
    if (in_RCX < in_RDX) {
      puVar3 = v_array<unsigned_int>::operator[](this_00,1);
      *puVar3 = 0;
      puVar3 = v_array<unsigned_int>::operator[](this_00,2);
      *puVar3 = 0;
    }
    if (in_R8 == 0) {
      puVar3 = v_array<unsigned_int>::operator[](this_00,4);
      *puVar3 = 0;
    }
    else if (in_RDX <= in_RCX + 1) {
      in_stack_ffffffffffffff90 = this;
      uVar1 = v_array<unsigned_int>::last(&ptVar2->stack);
      puVar3 = v_array<unsigned_int>::operator[](in_stack_ffffffffffffff90,(ulong)uVar1);
      if (*puVar3 == 9999999) {
        puVar3 = v_array<unsigned_int>::operator[](this_00,4);
        *puVar3 = 0;
      }
    }
    if (in_R8 == 0) {
      puVar3 = v_array<unsigned_int>::operator[](this_00,3);
      *puVar3 = 0;
      puVar3 = v_array<unsigned_int>::operator[](this_00,2);
      *puVar3 = 0;
    }
    else {
      in_stack_ffffffffffffff88 = this;
      uVar1 = v_array<unsigned_int>::last(&ptVar2->stack);
      puVar3 = v_array<unsigned_int>::operator[](in_stack_ffffffffffffff88,(ulong)uVar1);
      if (*puVar3 != 9999999) {
        puVar3 = v_array<unsigned_int>::operator[](this_00,3);
        *puVar3 = 0;
      }
      if ((in_RDX <= in_RCX) &&
         (puVar3 = v_array<unsigned_int>::operator[](this,in_RDX), *puVar3 != 9999999)) {
        puVar3 = v_array<unsigned_int>::operator[](this_00,2);
        *puVar3 = 0;
      }
    }
    for (local_68 = 1; local_68 < 5; local_68 = local_68 + 1) {
      puVar3 = v_array<unsigned_int>::operator[](this_00,(ulong)local_68);
      if (*puVar3 != 0) {
        v_array<unsigned_int>::push_back
                  (in_stack_ffffffffffffff90,(uint *)in_stack_ffffffffffffff88);
      }
    }
  }
  return;
}

Assistant:

void get_valid_actions(Search::search &sch, v_array<uint32_t> &valid_action, uint64_t idx, uint64_t n,
    uint64_t stack_depth, uint64_t state)
{
  task_data *data = sch.get_task_data<task_data>();
  uint32_t &sys = data->transition_system;
  v_array<uint32_t> &stack = data->stack, &heads = data->heads, &temp = data->temp;
  valid_action.clear();
  if (sys == arc_hybrid)
  {
    if (idx <= n)  // SHIFT
      valid_action.push_back(SHIFT);
    if (stack_depth >= 2)  // RIGHT
      valid_action.push_back(REDUCE_RIGHT);
    if (stack_depth >= 1 && state != 0 && idx <= n)  // LEFT
      valid_action.push_back(REDUCE_LEFT);
  }
  else if (sys == arc_eager)  // assume root is in N+1
  {
    temp.clear();
    for (size_t i = 0; i <= 4; i++) temp.push_back(1);
    if (idx > n)
    {
      temp[SHIFT] = 0;
      temp[REDUCE_RIGHT] = 0;
    }

    if (stack_depth == 0)
      temp[REDUCE] = 0;
    else if (idx <= n + 1 && heads[stack.last()] == my_null)
      temp[REDUCE] = 0;

    if (stack_depth == 0)
    {
      temp[REDUCE_LEFT] = 0;
      temp[REDUCE_RIGHT] = 0;
    }
    else
    {
      if (heads[stack.last()] != my_null)
        temp[REDUCE_LEFT] = 0;
      if (idx <= n && heads[idx] != my_null)
        temp[REDUCE_RIGHT] = 0;
    }
    for (uint32_t i = 1; i <= 4; i++)
    {
      if (temp[i])
        valid_action.push_back(i);
    }
  }
}